

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O1

Vector3D * __thiscall CGL::Matrix3x3::operator*(Matrix3x3 *this,Vector3D *x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Vector3D *in_RDI;
  
  dVar1 = x->x;
  dVar2 = this->entries[0].y;
  dVar3 = this->entries[0].z;
  dVar4 = x->y;
  dVar5 = this->entries[1].y;
  dVar6 = this->entries[1].z;
  dVar7 = x->z;
  dVar8 = this->entries[2].y;
  dVar9 = this->entries[2].z;
  in_RDI->x = this->entries[2].x * dVar7 + this->entries[1].x * dVar4 + this->entries[0].x * dVar1;
  in_RDI->y = dVar8 * dVar7 + dVar5 * dVar4 + dVar2 * dVar1;
  in_RDI->z = dVar7 * dVar9 + dVar4 * dVar6 + dVar1 * dVar3;
  return in_RDI;
}

Assistant:

Vector3D Matrix3x3::operator*( const Vector3D& x ) const {
    return x[0]*entries[0] +
           x[1]*entries[1] +
           x[2]*entries[2] ;
  }